

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest11InhibitPolicyMapping_::
Section11InvalidinhibitPolicyMappingTest6<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(Section11InvalidinhibitPolicyMappingTest6<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.11.6";
  local_88.should_validate = false;
  PkitsTestInfo::SetUserConstrainedPolicySet(&local_88,"");
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<5ul,4ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_3f4b62_006cd4a0,(char *(*) [5])&PTR_anon_var_dwarf_3f4b94_006cd4d0,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest11InhibitPolicyMapping,
                     Section11InvalidinhibitPolicyMappingTest6) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "inhibitPolicyMapping1P12CACert",
                               "inhibitPolicyMapping1P12subCAIPM5Cert",
                               "inhibitPolicyMapping1P12subsubCAIPM5Cert",
                               "InvalidinhibitPolicyMappingTest6EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "inhibitPolicyMapping1P12CACRL",
                              "inhibitPolicyMapping1P12subCAIPM5CRL",
                              "inhibitPolicyMapping1P12subsubCAIPM5CRL"};
  PkitsTestInfo info;
  info.test_number = "4.11.6";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}